

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int idaLsBandDQJac(sunrealtype tt,sunrealtype c_j,N_Vector yy,N_Vector yp,N_Vector rr,SUNMatrix Jac,
                  IDAMem IDA_mem,N_Vector tmp1,N_Vector tmp2,N_Vector tmp3)

{
  long *plVar1;
  double dVar2;
  void *pvVar3;
  int iVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  sunindextype sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  sunrealtype *psVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long j;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double local_f8;
  long local_e8;
  long local_e0;
  
  pvVar3 = IDA_mem->ida_lmem;
  sVar5 = SUNBandMatrix_Columns(Jac);
  sVar6 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar7 = SUNBandMatrix_LowerBandwidth(Jac);
  lVar8 = N_VGetArrayPointer(IDA_mem->ida_ewt);
  lVar9 = N_VGetArrayPointer(rr);
  lVar10 = N_VGetArrayPointer(yy);
  lVar11 = N_VGetArrayPointer(yp);
  lVar12 = N_VGetArrayPointer(tmp1);
  lVar13 = N_VGetArrayPointer(tmp2);
  lVar14 = N_VGetArrayPointer(tmp3);
  if (IDA_mem->ida_constraintsSet == 0) {
    local_e8 = 0;
  }
  else {
    local_e8 = N_VGetArrayPointer(IDA_mem->ida_constraints);
  }
  N_VScale(0x3ff0000000000000,yy,tmp2);
  N_VScale(0x3ff0000000000000,yp,tmp3);
  dVar2 = IDA_mem->ida_uround;
  local_f8 = 0.0;
  if (0.0 < dVar2) {
    if (dVar2 < 0.0) {
      local_f8 = sqrt(dVar2);
    }
    else {
      local_f8 = SQRT(dVar2);
    }
  }
  lVar20 = sVar6 + sVar7 + 1;
  lVar21 = sVar5;
  if (lVar20 < sVar5) {
    lVar21 = lVar20;
  }
  if (lVar21 < 1) {
    lVar21 = 0;
  }
  lVar19 = 1;
  local_e0 = 0;
  do {
    if (lVar19 == lVar21 + 1) {
      return 0;
    }
    j = lVar19 + -1;
    for (lVar15 = j; lVar15 < sVar5; lVar15 = lVar15 + lVar20) {
      dVar2 = *(double *)(lVar10 + lVar15 * 8);
      dVar24 = *(double *)(lVar11 + lVar15 * 8) * IDA_mem->ida_hh;
      dVar25 = ABS(dVar24);
      dVar23 = ABS(dVar2);
      if (ABS(dVar2) <= dVar25) {
        dVar23 = dVar25;
      }
      dVar26 = 1.0 / *(double *)(lVar8 + lVar15 * 8);
      dVar25 = dVar23 * local_f8;
      if (dVar23 * local_f8 <= dVar26) {
        dVar25 = dVar26;
      }
      uVar22 = -(ulong)(dVar24 < 0.0);
      dVar23 = ((double)((ulong)-dVar25 & uVar22 | ~uVar22 & (ulong)dVar25) + dVar2) - dVar2;
      if (IDA_mem->ida_constraintsSet != 0) {
        dVar24 = *(double *)(local_e8 + lVar15 * 8);
        dVar25 = ABS(dVar24);
        if ((dVar25 != 1.0) || (NAN(dVar25))) {
          if ((dVar25 == 2.0) && ((!NAN(dVar25) && ((dVar2 + dVar23) * dVar24 <= 0.0))))
          goto LAB_00113d0f;
        }
        else if ((dVar2 + dVar23) * dVar24 < 0.0) {
LAB_00113d0f:
          dVar23 = -dVar23;
        }
      }
      *(double *)(lVar13 + lVar15 * 8) = dVar23 + *(double *)(lVar13 + lVar15 * 8);
      *(double *)(lVar14 + lVar15 * 8) = c_j * dVar23 + *(double *)(lVar14 + lVar15 * 8);
    }
    iVar4 = (*IDA_mem->ida_res)(tt,tmp2,tmp3,tmp1,IDA_mem->ida_user_data);
    plVar1 = (long *)((long)pvVar3 + 0xa8);
    *plVar1 = *plVar1 + 1;
    lVar15 = local_e0;
    if (iVar4 != 0) {
      return iVar4;
    }
    for (; j < sVar5; j = j + lVar20) {
      dVar2 = *(double *)(lVar10 + j * 8);
      *(double *)(lVar13 + j * 8) = dVar2;
      dVar23 = *(double *)(lVar11 + j * 8);
      *(double *)(lVar14 + j * 8) = dVar23;
      psVar16 = SUNBandMatrix_Column(Jac,j);
      dVar23 = dVar23 * IDA_mem->ida_hh;
      dVar25 = ABS(dVar23);
      dVar24 = ABS(dVar2);
      if (ABS(dVar2) <= dVar25) {
        dVar24 = dVar25;
      }
      dVar26 = 1.0 / *(double *)(lVar8 + j * 8);
      dVar25 = dVar24 * local_f8;
      if (dVar24 * local_f8 <= dVar26) {
        dVar25 = dVar26;
      }
      uVar22 = -(ulong)(dVar23 < 0.0);
      dVar23 = ((double)((ulong)-dVar25 & uVar22 | ~uVar22 & (ulong)dVar25) + dVar2) - dVar2;
      if (IDA_mem->ida_constraintsSet != 0) {
        dVar24 = *(double *)(local_e8 + j * 8);
        dVar25 = ABS(dVar24);
        if ((dVar25 != 1.0) || (NAN(dVar25))) {
          if ((dVar25 == 2.0) && ((!NAN(dVar25) && ((dVar2 + dVar23) * dVar24 <= 0.0))))
          goto LAB_00113ebb;
        }
        else if ((dVar2 + dVar23) * dVar24 < 0.0) {
LAB_00113ebb:
          dVar23 = -dVar23;
        }
      }
      lVar17 = j - sVar6;
      if (lVar17 < 1) {
        lVar17 = 0;
      }
      lVar18 = sVar7 + j;
      if (sVar5 + -1 <= sVar7 + j) {
        lVar18 = sVar5 + -1;
      }
      for (; lVar17 <= lVar18; lVar17 = lVar17 + 1) {
        *(double *)((long)psVar16 + lVar17 * 8 + lVar15) =
             (*(double *)(lVar12 + lVar17 * 8) - *(double *)(lVar9 + lVar17 * 8)) * (1.0 / dVar23);
      }
      lVar15 = lVar15 + ~(sVar6 + sVar7) * 8;
    }
    lVar19 = lVar19 + 1;
    local_e0 = local_e0 + -8;
  } while( true );
}

Assistant:

int idaLsBandDQJac(sunrealtype tt, sunrealtype c_j, N_Vector yy, N_Vector yp,
                   N_Vector rr, SUNMatrix Jac, IDAMem IDA_mem, N_Vector tmp1,
                   N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype inc, inc_inv, yj, ypj, srur, conj, ewtj;
  sunrealtype *y_data, *yp_data, *ewt_data, *cns_data = NULL;
  sunrealtype *ytemp_data, *yptemp_data, *rtemp_data, *r_data, *col_j;
  N_Vector rtemp, ytemp, yptemp;
  sunindextype i, j, i1, i2, width, ngroups, group;
  sunindextype N, mupper, mlower;
  IDALsMem idals_mem;
  int retval = 0;

  /* access LsMem interface structure */
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of r, y and yp */
  rtemp  = tmp1;
  ytemp  = tmp2;
  yptemp = tmp3;

  /* Obtain pointers to the data for all eight vectors used.  */
  ewt_data    = N_VGetArrayPointer(IDA_mem->ida_ewt);
  r_data      = N_VGetArrayPointer(rr);
  y_data      = N_VGetArrayPointer(yy);
  yp_data     = N_VGetArrayPointer(yp);
  rtemp_data  = N_VGetArrayPointer(rtemp);
  ytemp_data  = N_VGetArrayPointer(ytemp);
  yptemp_data = N_VGetArrayPointer(yptemp);
  if (IDA_mem->ida_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(IDA_mem->ida_constraints);
  }

  /* Initialize ytemp and yptemp. */
  N_VScale(ONE, yy, ytemp);
  N_VScale(ONE, yp, yptemp);

  /* Compute miscellaneous values for the Jacobian computation. */
  srur    = SUNRsqrt(IDA_mem->ida_uround);
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all yy[j] and yp[j] for j in this group. */
    for (j = group - 1; j < N; j += width)
    {
      yj   = y_data[j];
      ypj  = yp_data[j];
      ewtj = ewt_data[j];

      /* Set increment inc to yj based on sqrt(uround)*abs(yj), with
        adjustments using ypj and ewtj if this is small, and a further
        adjustment to give it the same sign as hh*ypj. */
      inc = SUNMAX(srur * SUNMAX(SUNRabs(yj), SUNRabs(IDA_mem->ida_hh * ypj)),
                   ONE / ewtj);
      if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
      inc = (yj + inc) - yj;

      /* Adjust sign(inc) again if yj has an inequality constraint. */
      if (IDA_mem->ida_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      /* Increment yj and ypj. */
      ytemp_data[j] += inc;
      yptemp_data[j] += c_j * inc;
    }

    /* Call res routine with incremented arguments. */
    retval = IDA_mem->ida_res(tt, ytemp, yptemp, rtemp, IDA_mem->ida_user_data);
    idals_mem->nreDQ++;
    if (retval != 0) { break; }

    /* Loop over the indices j in this group again. */
    for (j = group - 1; j < N; j += width)
    {
      /* Reset ytemp and yptemp components that were perturbed. */
      yj = ytemp_data[j] = y_data[j];
      ypj = yptemp_data[j] = yp_data[j];
      col_j                = SUNBandMatrix_Column(Jac, j);
      ewtj                 = ewt_data[j];

      /* Set increment inc exactly as above. */
      inc = SUNMAX(srur * SUNMAX(SUNRabs(yj), SUNRabs(IDA_mem->ida_hh * ypj)),
                   ONE / ewtj);
      if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
      inc = (yj + inc) - yj;
      if (IDA_mem->ida_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      /* Load the difference quotient Jacobian elements for column j */
      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv * (rtemp_data[i] - r_data[i]);
      }
    }
  }

  return (retval);
}